

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O3

void set_max_size_cb(Fl_Button *param_1,void *v)

{
  bool bVar1;
  int iVar2;
  Fl_Type *pFVar3;
  
  if ((char *)v != "LOAD") {
    if (Fl_Type::first == (Fl_Type *)0x0) {
      propagate_load(&the_panel->super_Fl_Group,"LOAD");
      return;
    }
    bVar1 = false;
    pFVar3 = Fl_Type::first;
    do {
      if (pFVar3->selected != '\0') {
        iVar2 = (*pFVar3->_vptr_Fl_Type[0x21])(pFVar3);
        if (iVar2 != 0) {
          current_widget[1].super_Fl_Type.next = *(Fl_Type **)&current_widget->o->w_;
          bVar1 = true;
        }
      }
      pFVar3 = pFVar3->next;
    } while (pFVar3 != (Fl_Type *)0x0);
    propagate_load(&the_panel->super_Fl_Group,"LOAD");
    if (bVar1) {
      set_modflag(1);
      return;
    }
  }
  return;
}

Assistant:

void set_max_size_cb(Fl_Button*, void* v) {
  if (v == LOAD) {
  } else {
    int mod = 0;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_window()) {
        Fl_Window_Type *win = (Fl_Window_Type*)current_widget;
        win->sr_max_w = win->o->w();
        win->sr_max_h = win->o->h();
        mod = 1;
      }
    }
    propagate_load(the_panel, LOAD);
    if (mod) set_modflag(1);
  }
}